

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::DivideBroadcastableLayerParams::MergePartialFromCodedStream
          (DivideBroadcastableLayerParams *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  WireType WVar2;
  pair<unsigned_int,_bool> pVar3;
  bool local_81;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  DivideBroadcastableLayerParams *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  bool bStack_c;
  undefined3 uStack_b;
  
  while( true ) {
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if ((input->buffer_ < input->buffer_end_) &&
       (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*input->buffer_;
      google::protobuf::io::CodedInputStream::Advance(input,1);
      local_81 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_81;
      pVar3 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar3.first;
      _bStack_c = CONCAT31(uStack_b,pVar3.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar3 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar3.first;
      _bStack_c = CONCAT31(uStack_b,pVar3.second);
    }
    tag_00 = local_10;
    if ((local_10 == 0) ||
       (WVar2 = google::protobuf::internal::WireFormatLite::GetTagWireType(local_10),
       WVar2 == WIRETYPE_END_GROUP)) break;
    bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool DivideBroadcastableLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.DivideBroadcastableLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
  handle_unusual:
    if (tag == 0 ||
        ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
        ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
      goto success;
    }
    DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.DivideBroadcastableLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.DivideBroadcastableLayerParams)
  return false;
#undef DO_
}